

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O0

ArrayBuffer<int,_4UL,_4UL> * __thiscall
de::ArrayBuffer<int,_4UL,_4UL>::operator=
          (ArrayBuffer<int,_4UL,_4UL> *this,ArrayBuffer<int,_4UL,_4UL> *other)

{
  undefined1 local_28 [8];
  ArrayBuffer<int,_4UL,_4UL> copied;
  ArrayBuffer<int,_4UL,_4UL> *other_local;
  ArrayBuffer<int,_4UL,_4UL> *this_local;
  
  copied.m_cap = (size_t)other;
  ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_28,other);
  swap(this,(ArrayBuffer<int,_4UL,_4UL> *)local_28);
  ~ArrayBuffer((ArrayBuffer<int,_4UL,_4UL> *)local_28);
  return this;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>& ArrayBuffer<T,Alignment,Stride>::operator= (const ArrayBuffer& other)
{
	ArrayBuffer copied(other);
	swap(copied);
	return *this;
}